

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

bool testing::internal::String::CaseInsensitiveWideCStringEquals(wchar_t *lhs,wchar_t *rhs)

{
  int iVar1;
  wchar_t *in_RSI;
  wchar_t *in_RDI;
  undefined1 local_1;
  
  if (in_RDI == (wchar_t *)0x0) {
    local_1 = in_RSI == (wchar_t *)0x0;
  }
  else if (in_RSI == (wchar_t *)0x0) {
    local_1 = false;
  }
  else {
    iVar1 = wcscasecmp(in_RDI,in_RSI);
    local_1 = iVar1 == 0;
  }
  return local_1;
}

Assistant:

bool String::CaseInsensitiveWideCStringEquals(const wchar_t* lhs,
                                              const wchar_t* rhs) {
  if (lhs == nullptr) return rhs == nullptr;

  if (rhs == nullptr) return false;

#if GTEST_OS_WINDOWS
  return _wcsicmp(lhs, rhs) == 0;
#elif GTEST_OS_LINUX && !GTEST_OS_LINUX_ANDROID
  return wcscasecmp(lhs, rhs) == 0;
#else
  // Android, Mac OS X and Cygwin don't define wcscasecmp.
  // Other unknown OSes may not define it either.
  wint_t left, right;
  do {
    left = towlower(*lhs++);
    right = towlower(*rhs++);
  } while (left && left == right);
  return left == right;
#endif  // OS selector
}